

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-timed.c
# Opt level: O1

_Bool mon_dec_timed(monster *mon,wchar_t effect_type,wchar_t timer,wchar_t flag)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t timer_00;
  
  if (effect_type < L'\0') {
    __assert_fail("effect_type >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-timed.c"
                  ,0x123,"_Bool mon_dec_timed(struct monster *, int, int, int)");
  }
  if (effect_type < L'\n') {
    if (L'\0' < timer) {
      wVar2 = mon->m_timed[(uint)effect_type] - timer;
      timer_00 = L'\0';
      if (L'\0' < wVar2) {
        timer_00 = wVar2;
      }
      _Var1 = mon_set_timed(mon,effect_type,timer_00,flag);
      return _Var1;
    }
    __assert_fail("timer > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-timed.c"
                  ,0x125,"_Bool mon_dec_timed(struct monster *, int, int, int)");
  }
  __assert_fail("effect_type < MON_TMD_MAX",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-timed.c"
                ,0x124,"_Bool mon_dec_timed(struct monster *, int, int, int)");
}

Assistant:

bool mon_dec_timed(struct monster *mon, int effect_type, int timer, int flag)
{
	assert(effect_type >= 0);
	assert(effect_type < MON_TMD_MAX);
	assert(timer > 0); /* For negative amounts, we use mon_inc_timed instead */

	int new_level = mon->m_timed[effect_type] - timer;
	if (new_level < 0) {
		new_level = 0;
	}

	return mon_set_timed(mon, effect_type, new_level, flag);
}